

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CouchDBInterface.cc
# Opt level: O0

bool __thiscall CouchDBInterface::sendDocument(CouchDBInterface *this,JSONObject *object)

{
  CURL *pCVar1;
  FILE *pFVar2;
  size_t sVar3;
  bool bVar4;
  FILE *__stream;
  char *__s;
  undefined8 uVar5;
  mapped_type *this_00;
  byte local_239;
  allocator<char> local_1a9;
  key_type local_1a8;
  allocator local_181;
  string local_180;
  allocator<char> local_159;
  string local_158 [35];
  byte local_135;
  int local_134;
  bool couchok;
  undefined8 uStack_130;
  CURLcode result;
  curl_slist *slist;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string url;
  char *errbuf;
  FILE *responseptr;
  size_t response_size;
  char *response;
  string towritestring;
  JSONObject *object_local;
  CouchDBInterface *this_local;
  
  towritestring.field_2._8_8_ = object;
  JSON::JSONObject::toString_abi_cxx11_((string *)&response,object,0);
  response_size = 0;
  responseptr = (FILE *)0x0;
  __stream = open_memstream((char **)&response_size,(size_t *)&responseptr);
  __s = (char *)operator_new__(0x100);
  curl_easy_setopt(this->handle,0x2f,1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&slist,
                 "http://",&this->server);
  std::operator+(&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&slist,":");
  std::operator+(&local_e8,&local_108,&this->port);
  std::operator+(&local_c8,&local_e8,"/");
  std::operator+(&local_a8,&local_c8,&this->databasename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 &local_a8,"/");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&slist);
  pCVar1 = this->handle;
  uVar5 = std::__cxx11::string::c_str();
  curl_easy_setopt(pCVar1,0x2712,uVar5);
  pCVar1 = this->handle;
  uVar5 = std::__cxx11::string::c_str();
  curl_easy_setopt(pCVar1,0x271f,uVar5);
  curl_easy_setopt(this->handle,0x2711,__stream);
  uStack_130 = curl_slist_append(0,"Content-Type: application/json");
  curl_easy_setopt(this->handle,0x2727,uStack_130);
  curl_easy_setopt(this->handle,0x271a,__s);
  local_134 = curl_easy_perform(this->handle);
  fclose(__stream);
  curl_slist_free_all(uStack_130);
  local_135 = 0;
  if (local_134 == 0) {
    std::__cxx11::string::operator=((string *)&this->last_curl_error,"");
    sVar3 = response_size;
    pFVar2 = responseptr;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,(char *)sVar3,(ulong)pFVar2,&local_181);
    JSON::JSONObject::fromString(&this->last_couch_result,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"ok",&local_1a9);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
              ::operator[](&(this->last_couch_result).
                            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                           ,&local_1a8);
    bVar4 = JSON::JSONValue::isBoolTrue(this_00);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    if (bVar4) {
      local_135 = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_158,__s,&local_159);
    std::__cxx11::string::operator=((string *)&this->last_curl_error,local_158);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator(&local_159);
  }
  if (__s != (char *)0x0) {
    operator_delete(__s,1);
  }
  free((void *)response_size);
  local_239 = 0;
  if (local_134 == 0) {
    local_239 = local_135;
  }
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&response);
  return (bool)(local_239 & 1);
}

Assistant:

bool CouchDBInterface::sendDocument(const JSONObject &object) {
	//here is what we want to send to couchdb
	string towritestring=object.toString();
	//here is space to store the response from the db
	char *response=NULL;
	size_t response_size=0;
    FILE *responseptr=open_memstream(&response,&response_size);
	//here is space to put curl error messages in
	char *errbuf=new char[CURL_ERROR_SIZE];
	//set up the curl options
	curl_easy_setopt(handle,CURLOPT_POST,1L);
	string url="http://"+server+":"+port+"/"+databasename+"/";
	curl_easy_setopt(handle,CURLOPT_URL,url.c_str());
	curl_easy_setopt(handle,CURLOPT_POSTFIELDS,towritestring.c_str());
	curl_easy_setopt(handle,CURLOPT_WRITEDATA,responseptr);
	struct curl_slist *slist=curl_slist_append(NULL, "Content-Type: application/json");
	curl_easy_setopt(handle,CURLOPT_HTTPHEADER,slist);
	curl_easy_setopt(handle,CURLOPT_ERRORBUFFER,errbuf);
	//perform the operation
	CURLcode result=curl_easy_perform(handle);
	//cleanup
    fclose(responseptr); //this has to be done to access the buffer
	curl_slist_free_all(slist);
	//check for curl error
	bool couchok=false;
	if(result!=CURLE_OK) {
		last_curl_error=string(errbuf);
	} else {
		last_curl_error="";
		last_couch_result.fromString(string(response,response_size));
		if(last_couch_result["ok"].isBoolTrue()) couchok=true; 
	}
	delete errbuf;
	//check for couchdb error
	free(response);
	return (result==0)&&couchok;
}